

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix-qdf.cc
# Opt level: O2

void __thiscall QdfFixer::writeBinary(QdfFixer *this,unsigned_long_long val,size_t bytes)

{
  logic_error *this_00;
  string data;
  
  if (bytes < 9) {
    data._M_dataplus._M_p = (pointer)&data.field_2;
    std::__cxx11::string::_M_construct((ulong)&data,(char)bytes);
    while (bytes != 0) {
      data._M_dataplus._M_p[bytes - 1] = (char)val;
      val = val >> 8;
      bytes = bytes - 1;
    }
    std::operator<<(this->out,(string *)&data);
    std::__cxx11::string::~string((string *)&data);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"fix-qdf::writeBinary called with too many bytes");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QdfFixer::writeBinary(unsigned long long val, size_t bytes)
{
    if (bytes > sizeof(unsigned long long)) {
        throw std::logic_error("fix-qdf::writeBinary called with too many bytes");
    }
    std::string data(bytes, '\0');
    for (auto i = bytes; i > 0; --i) {
        data[i - 1] = static_cast<char>(val & 0xff); // i.e. val % 256
        val >>= 8;                                   // i.e. val = val / 256
    }
    out << data;
}